

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterEdgeCase::init
          (InvariantOuterEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  RenderTarget *renderTarget;
  ulong extraout_RAX;
  size_type sVar3;
  ShaderProgram *pSVar4;
  RenderContext *renderCtx;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *pTVar7;
  reference pvVar8;
  TestError *this_00;
  MessageBuilder *pMVar9;
  ulong uVar10;
  char *code;
  int precision;
  undefined1 in_R9B;
  string local_680;
  MessageBuilder local_660;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  ScopedLogSection local_460;
  ScopedLogSection section;
  TransformFeedbackMode local_450;
  allocator<char> local_449;
  string local_448;
  TransformFeedbackVarying local_428;
  string local_408;
  ShaderSource local_3e8;
  string local_3c0;
  ShaderSource local_3a0;
  string local_378;
  ShaderSource local_358;
  string local_330;
  ShaderSource local_310;
  ProgramSources local_2e8;
  SharedPtr<const_glu::ShaderProgram> local_218;
  Program local_208;
  allocator<char> local_1e9;
  string local_1e8 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string tessellationEvaluationTemplate;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string tessellationControlTemplate;
  allocator<char> local_69;
  string local_68 [8];
  string vertexShaderTemplate;
  string floatLit01;
  int programNdx;
  bool usePointMode;
  int usePointModeI;
  Winding winding;
  int windingI;
  InvariantOuterEdgeCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  usePointModeI = 0;
  uVar10 = extraout_RAX;
  do {
    if (1 < usePointModeI) {
      return (int)uVar10;
    }
    for (programNdx = 0; programNdx < 2; programNdx = programNdx + 1) {
      sVar3 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
              ::size(&this->m_programs);
      floatLit01.field_2._12_4_ = (undefined4)sVar3;
      de::floatToString_abi_cxx11_
                ((string *)((long)&vertexShaderTemplate.field_2 + 8),(de *)0x2,
                 10.0 / (float)(floatLit01.field_2._12_4_ + 10),precision);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_68,
                 "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                 ,&local_69);
      std::allocator<char>::~allocator(&local_69);
      tessellationEvaluationTemplate.field_2._12_4_ = floatLit01.field_2._12_4_ + 1;
      de::toString<int>(&local_e0,(int *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xc)
                       );
      std::operator+(&local_c0,
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                     &local_e0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_c0,
                     ") out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
                    );
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      code = (char *)(ulong)(uint)usePointModeI;
      Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
                 (_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,usePointModeI
                 ,(uint)(programNdx != 0),(bool)in_R9B);
      std::operator+(&local_1a8,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fragmentShaderTemplate.field_2 + 8));
      std::operator+(&local_188,&local_1a8,
                     "\nout highp vec4 in_f_color;\ninvariant out highp vec3 out_te_tessCoord;\n\nvoid main (void)\n{\n\tgl_Position = vec4(gl_TessCoord.xy*"
                    );
      std::operator+(&local_168,&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vertexShaderTemplate.field_2 + 8));
      std::operator+(&local_148,&local_168,
                     " - float(gl_PrimitiveID)*0.05, 0.0, 1.0);\n\tin_f_color = vec4(");
      std::operator+(&local_128,&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&vertexShaderTemplate.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128,");\n\tout_te_tessCoord = gl_TessCoord;\n}\n");
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e8,
                 "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                 ,&local_1e9);
      std::allocator<char>::~allocator(&local_1e9);
      pSVar4 = (ShaderProgram *)operator_new(0xd0);
      section.m_log._7_1_ = 1;
      renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_2e8);
      pCVar1 = (this->super_TestCase).m_context;
      pCVar5 = (Context *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_330,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
      glu::VertexSource::VertexSource((VertexSource *)&local_310,&local_330);
      pPVar6 = glu::ProgramSources::operator<<(&local_2e8,&local_310);
      pCVar1 = (this->super_TestCase).m_context;
      pCVar5 = (Context *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_378,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)&local_358,&local_378);
      pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_358);
      pCVar1 = (this->super_TestCase).m_context;
      pCVar5 = (Context *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_3c0,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_3a0,&local_3c0);
      pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_3a0);
      pCVar1 = (this->super_TestCase).m_context;
      pCVar5 = (Context *)std::__cxx11::string::c_str();
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_408,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_3e8,&local_408);
      pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_3e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_448,"out_te_tessCoord",&local_449);
      glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_428,&local_448);
      pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_428);
      glu::TransformFeedbackMode::TransformFeedbackMode(&local_450,0x8c8c);
      pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_450);
      glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,pPVar6);
      section.m_log._7_1_ = 0;
      de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_218,pSVar4);
      Program::Program(&local_208,usePointModeI,programNdx != 0,&local_218);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
      ::push_back(&this->m_programs,&local_208);
      Program::~Program(&local_208);
      de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_218);
      glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::allocator<char>::~allocator(&local_449);
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      glu::TessellationEvaluationSource::~TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      glu::TessellationControlSource::~TessellationControlSource
                ((TessellationControlSource *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      glu::VertexSource::~VertexSource((VertexSource *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      glu::ProgramSources::~ProgramSources(&local_2e8);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      de::toString<int>(&local_4a0,(int *)(floatLit01.field_2._M_local_buf + 0xc));
      std::operator+(&local_480,"Program",&local_4a0);
      de::toString<int>(&local_4e0,(int *)(floatLit01.field_2._M_local_buf + 0xc));
      std::operator+(&local_4c0,"Program ",&local_4e0);
      tcu::ScopedLogSection::ScopedLogSection(&local_460,pTVar7,&local_480,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&local_4a0);
      if (floatLit01.field_2._12_4_ == 0) {
LAB_0207ea8a:
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        pvVar8 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                 ::back(&this->m_programs);
        pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&pvVar8->program);
        glu::operator<<(pTVar7,pSVar4);
      }
      else {
        pvVar8 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                 ::back(&this->m_programs);
        pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&pvVar8->program);
        bVar2 = glu::ShaderProgram::isOk(pSVar4);
        if (!bVar2) goto LAB_0207ea8a;
      }
      pvVar8 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
               ::back(&this->m_programs);
      pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&pvVar8->program);
      bVar2 = glu::ShaderProgram::isOk(pSVar4);
      if (!bVar2) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Program compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0xfa4);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (0 < (int)floatLit01.field_2._12_4_) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_660,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_660,(char (*) [15])"Note: program ");
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(int *)(floatLit01.field_2._M_local_buf + 0xc));
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [65])
                                   " is similar to above, except some constants are different, and: "
                           );
        pvVar8 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                 ::back(&this->m_programs);
        Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                  (&local_680,pvVar8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_680);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_680);
        tcu::MessageBuilder::~MessageBuilder(&local_660);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_460);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string((string *)(vertexShaderTemplate.field_2._M_local_buf + 8));
    }
    usePointModeI = usePointModeI + 1;
    uVar10 = (ulong)(uint)usePointModeI;
  } while( true );
}

Assistant:

void InvariantOuterEdgeCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	for (int windingI = 0; windingI < WINDING_LAST; windingI++)
	{
		const Winding winding = (Winding)windingI;

		for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
		{
			const bool		usePointMode	= usePointModeI != 0;
			const int		programNdx		= (int)m_programs.size();
			const string	floatLit01		= de::floatToString(10.0f / (float)(programNdx + 10), 2);

			std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
														 "\n"
														 "in highp float in_v_attr;\n"
														 "out highp float in_tc_attr;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	in_tc_attr = in_v_attr;\n"
														 "}\n");
			std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
														 "\n"
														 "layout (vertices = " + de::toString(programNdx+1) + ") out;\n"
														 "\n"
														 "in highp float in_tc_attr[];\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
														 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
														 "\n"
														 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
														 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
														 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
														 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
														 "}\n");
			std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
														 "\n"
														 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, winding, usePointMode) +
														 "\n"
														 "out highp vec4 in_f_color;\n"
														 "invariant out highp vec3 out_te_tessCoord;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	gl_Position = vec4(gl_TessCoord.xy*" + floatLit01 + " - float(gl_PrimitiveID)*0.05, 0.0, 1.0);\n"
														 "	in_f_color = vec4(" + floatLit01 + ");\n"
														 "	out_te_tessCoord = gl_TessCoord;\n"
														 "}\n");
			std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
														 "\n"
														 "layout (location = 0) out mediump vec4 o_color;\n"
														 "\n"
														 "in highp vec4 in_f_color;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	o_color = in_f_color;\n"
														 "}\n");

			m_programs.push_back(Program(winding, usePointMode,
										 SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
				<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
				<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
				<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
				<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
				<< glu::TransformFeedbackVarying		("out_te_tessCoord")
				<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)))));

			{
				const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program" + de::toString(programNdx), "Program " + de::toString(programNdx));

				if (programNdx == 0 || !m_programs.back().program->isOk())
					m_testCtx.getLog() << *m_programs.back().program;

				if (!m_programs.back().program->isOk())
					TCU_FAIL("Program compilation failed");

				if (programNdx > 0)
					m_testCtx.getLog() << TestLog::Message << "Note: program " << programNdx << " is similar to above, except some constants are different, and: " << m_programs.back().description() << TestLog::EndMessage;
			}
		}
	}
}